

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<char,_false,_false>::push_back
          (FastVector<char,_false,_false> *this,char *valPtr,uint elem)

{
  char cVar1;
  uint uVar2;
  uint local_20;
  uint i;
  uint elem_local;
  char *valPtr_local;
  FastVector<char,_false,_false> *this_local;
  
  if (this->count + elem < this->max) {
    for (local_20 = 0; local_20 < elem; local_20 = local_20 + 1) {
      cVar1 = valPtr[local_20];
      uVar2 = this->count;
      this->count = uVar2 + 1;
      this->data[uVar2] = cVar1;
    }
  }
  else {
    grow_and_add(this,this->count + elem,valPtr,elem);
  }
  return;
}

Assistant:

__forceinline void push_back(const T* valPtr, unsigned elem)
	{
		if(count + elem >= max)
		{
			grow_and_add(count + elem, valPtr, elem);
			return;
		}

		for(unsigned i = 0; i < elem; i++)
			data[count++] = valPtr[i];
	}